

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O1

void nn_sock_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  uint uVar1;
  int iVar2;
  code *UNRECOVERED_JUMPTABLE;
  uint extraout_EDX;
  uint extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  nn_fsm_fn p_Var3;
  ulong uVar4;
  nn_list *self_00;
  
  iVar2 = *(int *)&self[1].fn;
  if (iVar2 == 1) {
LAB_001206f0:
    if (src == -2) {
      if (type == 1) {
LAB_00120710:
        nn_sock_action_zombify((nn_sock *)self);
        return;
      }
      src = 0xfffffffe;
      if (type == 0xfffffffe) {
        ((nn_sock *)self)->state = 2;
        return;
      }
    }
    else {
LAB_00120782:
      src = type;
      nn_sock_handler_cold_5();
    }
    nn_sock_handler_cold_6();
LAB_00120792:
    nn_sock_handler_cold_2();
    type = extraout_EDX_01;
  }
  else {
    if (iVar2 != 2) {
      if (iVar2 == 3) {
        nn_sock_handler_cold_1();
      }
      nn_sock_handler_cold_7();
      type = extraout_EDX_00;
      goto LAB_00120782;
    }
    if (src == 1) {
      if (type == 1) {
        nn_list_erase((nn_list *)&self[3].owner,(nn_list_item *)((long)srcptr + 0x80));
        nn_ep_term((nn_ep *)srcptr);
        nn_free(srcptr);
        return;
      }
      goto LAB_00120792;
    }
    if (src == -2) {
      if (type == 1) goto LAB_00120710;
      self = (nn_fsm *)(ulong)(uint)type;
      nn_sock_handler_cold_3();
      type = extraout_EDX;
      goto LAB_001206f0;
    }
    if (type == 0x84c4) {
      p_Var3 = self[1].shutdown_fn;
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)p_Var3 + 0x28);
LAB_00120767:
      (*UNRECOVERED_JUMPTABLE)(p_Var3,srcptr);
      return;
    }
    if (type == 0x84c3) {
      p_Var3 = self[1].shutdown_fn;
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)p_Var3 + 0x20);
      goto LAB_00120767;
    }
  }
  uVar4 = (ulong)(uint)src;
  nn_sock_handler_cold_4();
  uVar1 = *(uint *)(uVar4 + 0x58);
  self_00 = (nn_list *)(ulong)uVar1;
  if (extraout_EDX_02 == -3 && type == -2) {
LAB_001207d0:
    nn_sock_shutdown_cold_3();
  }
  else {
    if (uVar1 != 4) {
      if (uVar1 == 5) {
        if ((type != -2) || (extraout_EDX_02 != 2)) {
          nn_sock_shutdown_cold_1();
          goto LAB_001208b8;
        }
        goto LAB_00120860;
      }
      nn_sock_shutdown_cold_2();
      goto LAB_001207d0;
    }
    if (extraout_EDX_02 != 1 || type != 1) {
      return;
    }
    nn_list_erase((nn_list *)(uVar4 + 0x128),&((nn_ep *)srcptr)->item);
    nn_ep_term((nn_ep *)srcptr);
    nn_free(srcptr);
  }
  iVar2 = nn_list_empty((nn_list *)(uVar4 + 0x128));
  if (iVar2 == 0) {
    return;
  }
  self_00 = (nn_list *)(uVar4 + 0x118);
  iVar2 = nn_list_empty(self_00);
  if (iVar2 == 0) {
LAB_001208b8:
    nn_sock_shutdown_cold_4();
    self_00[3].first = (nn_list_item *)self_00;
    *(undefined4 *)&self_00[3].last = 0xfffffffe;
    self_00[4].first = (nn_list_item *)0x0;
    *(undefined4 *)&self_00[4].last = 2;
    nn_ctx_raise((nn_ctx *)self_00[2].last,(nn_fsm_event *)(self_00 + 3));
    return;
  }
  *(undefined4 *)(uVar4 + 0x58) = 5;
  if (*(code **)**(undefined8 **)(uVar4 + 0x60) != (code *)0x0) {
    (**(code **)**(undefined8 **)(uVar4 + 0x60))();
    return;
  }
LAB_00120860:
  (**(code **)(**(long **)(uVar4 + 0x60) + 8))();
  *(undefined4 *)(uVar4 + 0x58) = 6;
  if ((*(byte *)(*(long *)(uVar4 + 0x68) + 8) & 1) == 0) {
    nn_efd_term((nn_efd *)(uVar4 + 0xd4));
  }
  if ((*(byte *)(*(long *)(uVar4 + 0x68) + 8) & 2) == 0) {
    nn_efd_term((nn_efd *)(uVar4 + 0xd0));
  }
  nn_sem_post((nn_sem *)(uVar4 + 0xd8));
  return;
}

Assistant:

static void nn_sock_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_sock *sock;
    struct nn_ep *ep;

    sock = nn_cont (self, struct nn_sock, fsm);

    switch (sock->state) {

/******************************************************************************/
/*  INIT state.                                                               */
/******************************************************************************/
    case NN_SOCK_STATE_INIT:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                sock->state = NN_SOCK_STATE_ACTIVE;
                return;
            case NN_SOCK_ACTION_ZOMBIFY:
                nn_sock_action_zombify (sock);
                return;
            default:
                nn_fsm_bad_action (sock->state, src, type);
            }

        default:
            nn_fsm_bad_source (sock->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_SOCK_STATE_ACTIVE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_SOCK_ACTION_ZOMBIFY:
                nn_sock_action_zombify (sock);
                return;
            default:
                nn_fsm_bad_action (sock->state, src, type);
            }

        case NN_SOCK_SRC_EP:
            switch (type) {
            case NN_EP_STOPPED:

                /*  This happens when an endpoint is closed using
                    nn_shutdown() function. */
                ep = (struct nn_ep*) srcptr;
                nn_list_erase (&sock->sdeps, &ep->item);
                nn_ep_term (ep);
                nn_free (ep);
                return;

            default:
                nn_fsm_bad_action (sock->state, src, type);
            }

        default:

            /*  The assumption is that all the other events come from pipes. */
            switch (type) {
            case NN_PIPE_IN:
                sock->sockbase->vfptr->in (sock->sockbase,
                    (struct nn_pipe*) srcptr);
                return;
            case NN_PIPE_OUT:
                sock->sockbase->vfptr->out (sock->sockbase,
                    (struct nn_pipe*) srcptr);
                return;
            default:
                nn_fsm_bad_action (sock->state, src, type);
            }
        }

/******************************************************************************/
/*  ZOMBIE state.                                                             */
/******************************************************************************/
    case NN_SOCK_STATE_ZOMBIE:
        nn_fsm_bad_state (sock->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (sock->state, src, type);
    }
}